

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O1

void __thiscall particleSamples::perform_particle_reconstruction(particleSamples *this)

{
  vector<particle_info,_std::allocator<particle_info>_> *pvVar1;
  vector<particle_info,std::allocator<particle_info>> *this_00;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  undefined4 uVar16;
  pointer paVar17;
  anon_struct_120_15_f999644b *__args;
  pointer paVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  iterator __position;
  ulong uVar22;
  ulong uVar23;
  bool bVar24;
  byte bVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  
  bVar25 = 0;
  if ((this->particle_monval == 0x14d) &&
     ((this->reconst_list_1->
      super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (this->reconst_list_1->
      super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
      )._M_impl.super__Vector_impl_data._M_start)) {
    uVar23 = 0;
    do {
      pvVar1 = (this->reconst_list_1->
               super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
               )._M_impl.super__Vector_impl_data._M_start[uVar23];
      paVar18 = (pvVar1->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&(pvVar1->super__Vector_base<particle_info,_std::allocator<particle_info>_>).
                   _M_impl.super__Vector_impl_data + 8) != paVar18) {
        uVar22 = 0;
        do {
          pvVar1 = (this->reconst_list_2->
                   super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                   )._M_impl.super__Vector_impl_data._M_start[uVar23];
          paVar17 = (pvVar1->super__Vector_base<particle_info,_std::allocator<particle_info>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          if (*(pointer *)
               ((long)&(pvVar1->super__Vector_base<particle_info,_std::allocator<particle_info>_>).
                       _M_impl.super__Vector_impl_data + 8) != paVar17) {
            dVar4 = paVar18[uVar22].px;
            dVar5 = (&paVar18[uVar22].px)[1];
            dVar6 = paVar18[uVar22].pz;
            dVar7 = (&paVar18[uVar22].pz)[1];
            dVar8 = paVar18[uVar22].x;
            dVar9 = (&paVar18[uVar22].x)[1];
            dVar10 = paVar18[uVar22].z;
            dVar11 = (&paVar18[uVar22].z)[1];
            uVar20 = 0;
            uVar21 = 1;
            do {
              dVar26 = paVar17[uVar20].px + dVar4;
              dVar28 = (&paVar17[uVar20].px)[1] + dVar5;
              dVar30 = paVar17[uVar20].pz + dVar6;
              dVar31 = (&paVar17[uVar20].pz)[1] + dVar7;
              dVar12 = paVar17[uVar20].x;
              dVar13 = (&paVar17[uVar20].x)[1];
              dVar14 = paVar17[uVar20].z;
              dVar15 = (&paVar17[uVar20].z)[1];
              dVar2 = ((dVar31 * dVar31 - dVar26 * dVar26) - dVar28 * dVar28) - dVar30 * dVar30;
              if (dVar2 < 0.0) {
                dVar2 = sqrt(dVar2);
              }
              else {
                dVar2 = SQRT(dVar2);
              }
              if (ABS(dVar2 + -1.019) < 0.00443) {
                dVar2 = dVar10 - dVar14;
                dVar3 = dVar11 - dVar15;
                dVar27 = dVar8 - dVar12;
                dVar29 = dVar9 - dVar13;
                dVar2 = dVar2 * dVar2 + dVar29 * dVar29 + dVar3 * dVar3 + dVar27 * dVar27;
                if (dVar2 < 0.0) {
                  dVar2 = sqrt(dVar2);
                }
                else {
                  dVar2 = SQRT(dVar2);
                }
                if (dVar2 < 0.01) {
                  __args = (anon_struct_120_15_f999644b *)operator_new(0x78);
                  __args->mass = 1.019;
                  __args->px = dVar26;
                  __args->py = dVar28;
                  __args->pz = dVar30;
                  __args->E = dVar31;
                  __args->x = (dVar12 + dVar8) * 0.5;
                  __args->y = (dVar13 + dVar9) * 0.5;
                  __args->z = (dVar14 + dVar10) * 0.5;
                  __args->t = (dVar15 + dVar11) * 0.5;
                  this_00 = (vector<particle_info,std::allocator<particle_info>> *)
                            (this->particle_list->
                            super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                            )._M_impl.super__Vector_impl_data._M_start[uVar23];
                  __position._M_current = *(anon_struct_120_15_f999644b **)(this_00 + 8);
                  if (__position._M_current == *(anon_struct_120_15_f999644b **)(this_00 + 0x10)) {
                    std::vector<particle_info,std::allocator<particle_info>>::
                    _M_realloc_insert<particle_info_const&>(this_00,__position,__args);
                  }
                  else {
                    for (lVar19 = 0xf; lVar19 != 0; lVar19 = lVar19 + -1) {
                      uVar16 = *(undefined4 *)&__args->field_0x4;
                      (__position._M_current)->monval = __args->monval;
                      *(undefined4 *)&(__position._M_current)->field_0x4 = uVar16;
                      __args = (anon_struct_120_15_f999644b *)
                               ((long)__args + (ulong)bVar25 * -0x10 + 8);
                      __position._M_current = __position._M_current + (ulong)bVar25 * -0x10 + 8;
                    }
                    *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x78;
                  }
                }
              }
              pvVar1 = (this->reconst_list_2->
                       super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                       )._M_impl.super__Vector_impl_data._M_start[uVar23];
              paVar17 = (pvVar1->super__Vector_base<particle_info,_std::allocator<particle_info>_>).
                        _M_impl.super__Vector_impl_data._M_start;
              uVar20 = ((long)*(pointer *)
                               ((long)&(pvVar1->
                                       super__Vector_base<particle_info,_std::allocator<particle_info>_>
                                       )._M_impl.super__Vector_impl_data + 8) - (long)paVar17 >> 3)
                       * -0x1111111111111111;
              bVar24 = uVar21 <= uVar20;
              lVar19 = uVar20 - uVar21;
              uVar20 = uVar21;
              uVar21 = (ulong)((int)uVar21 + 1);
            } while (bVar24 && lVar19 != 0);
          }
          uVar22 = (ulong)((int)uVar22 + 1);
          pvVar1 = (this->reconst_list_1->
                   super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                   )._M_impl.super__Vector_impl_data._M_start[uVar23];
          paVar18 = (pvVar1->super__Vector_base<particle_info,_std::allocator<particle_info>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          uVar20 = ((long)*(pointer *)
                           ((long)&(pvVar1->
                                   super__Vector_base<particle_info,_std::allocator<particle_info>_>
                                   )._M_impl.super__Vector_impl_data + 8) - (long)paVar18 >> 3) *
                   -0x1111111111111111;
        } while (uVar22 <= uVar20 && uVar20 - uVar22 != 0);
      }
      uVar23 = (ulong)((int)uVar23 + 1);
    } while (uVar23 < (ulong)((long)(this->reconst_list_1->
                                    super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->reconst_list_1->
                                    super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

void particleSamples::perform_particle_reconstruction() {
    if (particle_monval == 333) {
        // particle of interest is phi(1020)
        double particle_mass = 1.019;
        double particle_width = 0.00443;

        // now we loop over events
        for (unsigned int iev = 0; iev < reconst_list_1->size(); iev++) {
            // we first perfrom the (K^+, K^-) pair
            for (unsigned int i = 0; i < (*reconst_list_1)[iev]->size(); i++) {
                double E_1 = (*(*reconst_list_1)[iev])[i].E;
                double px_1 = (*(*reconst_list_1)[iev])[i].px;
                double py_1 = (*(*reconst_list_1)[iev])[i].py;
                double pz_1 = (*(*reconst_list_1)[iev])[i].pz;
                double t_1 = (*(*reconst_list_1)[iev])[i].t;
                double x_1 = (*(*reconst_list_1)[iev])[i].x;
                double y_1 = (*(*reconst_list_1)[iev])[i].y;
                double z_1 = (*(*reconst_list_1)[iev])[i].z;
                for (unsigned int j = 0; j < (*reconst_list_2)[iev]->size();
                     j++) {
                    double E_2 = (*(*reconst_list_2)[iev])[j].E;
                    double px_2 = (*(*reconst_list_2)[iev])[j].px;
                    double py_2 = (*(*reconst_list_2)[iev])[j].py;
                    double pz_2 = (*(*reconst_list_2)[iev])[j].pz;
                    double t_2 = (*(*reconst_list_2)[iev])[j].t;
                    double x_2 = (*(*reconst_list_2)[iev])[j].x;
                    double y_2 = (*(*reconst_list_2)[iev])[j].y;
                    double z_2 = (*(*reconst_list_2)[iev])[j].z;

                    // compute the invariant mass
                    double E = E_1 + E_2;
                    double px = px_1 + px_2;
                    double py = py_1 + py_2;
                    double pz = pz_1 + pz_2;
                    double invariant_mass =
                        sqrt(E * E - px * px - py * py - pz * pz);
                    if (std::abs(invariant_mass - particle_mass)
                        < particle_width) {
                        // phi(1020) resonance found
                        double spatial_distance = sqrt(
                            (t_1 - t_2) * (t_1 - t_2)
                            + (x_1 - x_2) * (x_1 - x_2)
                            + (y_1 - y_2) * (y_1 - y_2)
                            + (z_1 - z_2) * (z_1 - z_2));
                        if (spatial_distance < 0.01) {
                            // this is a real phi(1020)
                            particle_info *mother = new particle_info;
                            mother->mass = particle_mass;
                            mother->E = E;
                            mother->px = px;
                            mother->py = py;
                            mother->pz = pz;
                            mother->t = (t_1 + t_2) / 2.;
                            mother->x = (x_1 + x_2) / 2.;
                            mother->y = (y_1 + y_2) / 2.;
                            mother->z = (z_1 + z_2) / 2.;
                            (*particle_list)[iev]->push_back(*mother);
                        }
                    }
                }
            }
        }
    }
}